

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O3

void fy_emit_cleanup(fy_emitter *emit)

{
  fy_eventp_list *pfVar1;
  char *__ptr;
  list_head *plVar2;
  list_head *plVar3;
  fy_emitter_state *__ptr_00;
  fy_emit_save_ctx *__ptr_01;
  fy_eventp *fyep;
  
  if ((emit->fyd == (fy_document *)0x0) && (emit->fyds != (fy_document_state *)0x0)) {
    fy_document_state_unref(emit->fyds);
  }
  __ptr = (emit->ea).accum;
  if (__ptr != (emit->ea).inplace && __ptr != (char *)0x0) {
    free(__ptr);
  }
  pfVar1 = &emit->queued_events;
  fyep = (fy_eventp *)(emit->queued_events)._lh.next;
  if (fyep != (fy_eventp *)0x0 && fyep != (fy_eventp *)pfVar1) {
    do {
      plVar2 = (fyep->node).next;
      plVar3 = (fyep->node).prev;
      plVar2->prev = plVar3;
      plVar3->next = plVar2;
      (fyep->node).next = &fyep->node;
      (fyep->node).prev = &fyep->node;
      fy_eventp_release(fyep);
      fyep = (fy_eventp *)(pfVar1->_lh).next;
      if (fyep == (fy_eventp *)pfVar1) break;
    } while (fyep != (fy_eventp *)0x0);
  }
  __ptr_00 = emit->state_stack;
  if (__ptr_00 != emit->state_stack_inplace && __ptr_00 != (fy_emitter_state *)0x0) {
    free(__ptr_00);
  }
  __ptr_01 = emit->sc_stack;
  if (__ptr_01 != emit->sc_stack_inplace && __ptr_01 != (fy_emit_save_ctx *)0x0) {
    free(__ptr_01);
  }
  fy_diag_unref(emit->diag);
  return;
}

Assistant:

void fy_emit_cleanup(struct fy_emitter *emit) {
    struct fy_eventp *fyep;

    if (!emit->fyd && emit->fyds)
        fy_document_state_unref(emit->fyds);

    fy_emit_accum_cleanup(&emit->ea);

    while ((fyep = fy_eventp_list_pop(&emit->queued_events)) != NULL)
        fy_eventp_release(fyep);

    if (emit->state_stack && emit->state_stack != emit->state_stack_inplace)
        free(emit->state_stack);

    if (emit->sc_stack && emit->sc_stack != emit->sc_stack_inplace)
        free(emit->sc_stack);

    fy_diag_unref(emit->diag);
}